

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  bool bVar1;
  char *pcVar2;
  undefined1 *puVar3;
  Option *pOVar4;
  ulong uVar5;
  allocator<char> local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 *local_a8;
  undefined8 local_a0;
  string local_98;
  undefined4 local_78;
  undefined1 local_68 [8];
  string dummy2;
  string dummy1;
  bool ignore_used_subcommands_local;
  string *current_local;
  App *this_local;
  
  ::std::__cxx11::string::string((string *)(dummy2.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_68);
  bVar1 = ::std::operator==(current,"--");
  if (bVar1) {
    this_local._4_4_ = POSITIONAL_MARK;
  }
  else {
    bVar1 = _valid_subcommand(this,current,ignore_used_subcommands);
    if (bVar1) {
      this_local._4_4_ = SUBCOMMAND;
    }
    else {
      bVar1 = detail::split_long(current,(string *)((long)&dummy2.field_2 + 8),(string *)local_68);
      if (bVar1) {
        this_local._4_4_ = LONG;
      }
      else {
        bVar1 = detail::split_short(current,(string *)((long)&dummy2.field_2 + 8),(string *)local_68
                                   );
        if (bVar1) {
          pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)((long)&dummy2.field_2 + 8));
          if (('/' < *pcVar2) &&
             (pcVar2 = (char *)::std::__cxx11::string::operator[]
                                         ((ulong)((long)&dummy2.field_2 + 8)), *pcVar2 < ':')) {
            local_aa = 0x2d;
            puVar3 = (undefined1 *)
                     ::std::__cxx11::string::operator[]((ulong)((long)&dummy2.field_2 + 8));
            local_a9 = *puVar3;
            local_a8 = &local_aa;
            local_a0 = 2;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_98,local_a8,local_a0,&local_ab);
            pOVar4 = get_option_no_throw(this,&local_98);
            ::std::__cxx11::string::~string((string *)&local_98);
            ::std::allocator<char>::~allocator(&local_ab);
            if (pOVar4 == (Option *)0x0) {
              this_local._4_4_ = NONE;
              goto LAB_001978ab;
            }
          }
          this_local._4_4_ = SHORT;
        }
        else if (((this->allow_windows_style_options_ & 1U) == 0) ||
                (bVar1 = detail::split_windows_style
                                   (current,(string *)((long)&dummy2.field_2 + 8),(string *)local_68
                                   ), !bVar1)) {
          bVar1 = ::std::operator==(current,"++");
          if (((bVar1) && (uVar5 = ::std::__cxx11::string::empty(), (uVar5 & 1) == 0)) &&
             (this->parent_ != (App *)0x0)) {
            this_local._4_4_ = SUBCOMMAND_TERMINATOR;
          }
          else {
            this_local._4_4_ = NONE;
          }
        }
        else {
          this_local._4_4_ = WINDOWS;
        }
      }
    }
  }
LAB_001978ab:
  local_78 = 1;
  ::std::__cxx11::string::~string((string *)local_68);
  ::std::__cxx11::string::~string((string *)(dummy2.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

detail::Classifier _recognize(const std::string &current, bool ignore_used_subcommands = true) const {
        std::string dummy1, dummy2;

        if(current == "--")
            return detail::Classifier::POSITIONAL_MARK;
        if(_valid_subcommand(current, ignore_used_subcommands))
            return detail::Classifier::SUBCOMMAND;
        if(detail::split_long(current, dummy1, dummy2))
            return detail::Classifier::LONG;
        if(detail::split_short(current, dummy1, dummy2)) {
            if(dummy1[0] >= '0' && dummy1[0] <= '9') {
                if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                    return detail::Classifier::NONE;
                }
            }
            return detail::Classifier::SHORT;
        }
        if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
            return detail::Classifier::WINDOWS;
        if((current == "++") && !name_.empty() && parent_ != nullptr)
            return detail::Classifier::SUBCOMMAND_TERMINATOR;
        return detail::Classifier::NONE;
    }